

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

double HTS_lsp2en(HTS_Vocoder *v,double *lsp,size_t m,double alpha)

{
  undefined8 uVar1;
  void *pvVar2;
  double g;
  double *in_RDX;
  double *in_RSI;
  double in_RDI;
  double *in_XMM0_Qa;
  double dVar3;
  undefined1 auVar4 [16];
  double *buff;
  double en;
  size_t i;
  double *in_stack_00000038;
  HTS_Vocoder *in_stack_00000040;
  double g2;
  double *in_stack_ffffffffffffffd8;
  double *a2;
  ulong uVar5;
  
  g2 = 0.0;
  if (*(double **)((long)in_RDI + 0x90) < in_RDX) {
    if (*(long *)((long)in_RDI + 0x88) != 0) {
      HTS_free((void *)0x19db95);
    }
    pvVar2 = HTS_calloc((size_t)in_stack_ffffffffffffffd8,(size_t)g2);
    *(void **)((long)in_RDI + 0x88) = pvVar2;
    *(double **)((long)in_RDI + 0x90) = in_RDX;
  }
  g = (double)(*(long *)((long)in_RDI + 0x88) + (long)in_RDX * 8 + 8);
  HTS_lsp2lpc(in_stack_00000040,in_stack_00000038,(double *)v,lsp._4_4_);
  if (*(char *)((long)in_RDI + 0x18) == '\0') {
    **(double **)((long)in_RDI + 0x88) = *in_RSI;
  }
  else {
    dVar3 = exp(*in_RSI);
    **(double **)((long)in_RDI + 0x88) = dVar3;
  }
  HTS_ignorm(in_XMM0_Qa,in_stack_ffffffffffffffd8,(int)((ulong)g2 >> 0x20),g);
  for (a2 = (double *)0x1; a2 <= in_RDX; a2 = (double *)((long)a2 + 1)) {
    uVar1 = *(undefined8 *)((long)in_RDI + 8);
    auVar4._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    *(double *)(*(long *)((long)in_RDI + 0x88) + (long)a2 * 8) =
         -((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
         *(double *)(*(long *)((long)in_RDI + 0x88) + (long)a2 * 8);
  }
  HTS_mgc2mgc((HTS_Vocoder *)i,(double *)en,buff._4_4_,in_RDI,(double)in_RSI,in_RDX,
              (int)((ulong)in_XMM0_Qa >> 0x20),(double)a2,g2);
  for (uVar5 = 0; uVar5 < 0x240; uVar5 = uVar5 + 1) {
    g2 = *(double *)((long)g + uVar5 * 8) * *(double *)((long)g + uVar5 * 8) + g2;
  }
  return g2;
}

Assistant:

static double HTS_lsp2en(HTS_Vocoder * v, double *lsp, size_t m, double alpha)
{
   size_t i;
   double en = 0.0;
   double *buff;

   if (v->spectrum2en_size < m) {
      if (v->spectrum2en_buff != NULL)
         HTS_free(v->spectrum2en_buff);
      v->spectrum2en_buff = (double *) HTS_calloc(m + 1 + IRLENG, sizeof(double));
      v->spectrum2en_size = m;
   }
   buff = v->spectrum2en_buff + m + 1;

   /* lsp2lpc */
   HTS_lsp2lpc(v, lsp + 1, v->spectrum2en_buff, m);
   if (v->use_log_gain)
      v->spectrum2en_buff[0] = exp(lsp[0]);
   else
      v->spectrum2en_buff[0] = lsp[0];

   /* mgc2mgc */
   if (NORMFLG1)
      HTS_ignorm(v->spectrum2en_buff, v->spectrum2en_buff, m, v->gamma);
   else if (MULGFLG1)
      v->spectrum2en_buff[0] = (1.0 - v->spectrum2en_buff[0]) * ((double) v->stage);
   if (MULGFLG1)
      for (i = 1; i <= m; i++)
         v->spectrum2en_buff[i] *= -((double) v->stage);
   HTS_mgc2mgc(v, v->spectrum2en_buff, m, alpha, v->gamma, buff, IRLENG - 1, 0.0, 1);

   for (i = 0; i < IRLENG; i++)
      en += buff[i] * buff[i];
   return en;
}